

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_fanout_tree.h
# Opt level: O1

pair<int,_double>
alex::fanout_tree::find_best_fanout_bottom_up<int,int,alex::AlexCompare>
          (undefined8 expected_insert_frac,undefined8 values,undefined4 num_keys,long node,
          int total_keys,
          vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>
          *used_fanout_tree_nodes,int max_fanout,undefined4 max_data_node_keys,
          undefined1 approximate_model_computation,undefined1 approximate_cost_computation)

{
  double dVar1;
  pointer pFVar2;
  pointer pFVar3;
  FTNode *pFVar4;
  iterator __position;
  __normal_iterator<alex::fanout_tree::FTNode_*,_std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>
  __first;
  __normal_iterator<alex::fanout_tree::FTNode_*,_std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>
  __last;
  bool bVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined4 uVar11;
  int iVar12;
  int iVar13;
  undefined7 uVar14;
  uint uVar15;
  bool *pbVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  FTNode *tree_node;
  FTNode *__args;
  long lVar20;
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  pair<int,_double> pVar32;
  initializer_list<alex::fanout_tree::FTNode> __l;
  double best_cost;
  uint local_100;
  allocator_type local_f9;
  double local_f8;
  int local_f0;
  int local_ec;
  vector<double,_std::allocator<double>_> fanout_costs;
  vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  fanout_tree;
  double cost;
  pointer local_98;
  undefined8 local_90;
  long local_88;
  undefined8 local_80;
  vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_> new_level;
  
  local_f8 = (double)CONCAT44(local_f8._4_4_,num_keys);
  best_cost = *(double *)(node + 0x20) + 20.0;
  fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  fanout_tree.
  super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fanout_tree.
  super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fanout_tree.
  super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f0 = max_fanout;
  local_ec = total_keys;
  local_90 = values;
  local_88 = node;
  local_80 = expected_insert_frac;
  std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
            ((vector<double,std::allocator<double>> *)&fanout_costs,(iterator)0x0,&best_cost);
  new_level.
  super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  new_level.
  super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)best_cost;
  new_level.
  super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)((long)local_f8 << 0x20);
  __l._M_len = 1;
  __l._M_array = (iterator)&new_level;
  std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::vector
            ((vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_> *)&cost,
             __l,&local_f9);
  std::
  vector<std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>,std::allocator<std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>>>
  ::emplace_back<std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>>
            ((vector<std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>,std::allocator<std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>>>
              *)&fanout_tree,
             (vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_> *)&cost)
  ;
  if (cost != 0.0) {
    operator_delete((void *)cost,(long)local_98 - (long)cost);
  }
  local_100 = 0;
  if (1 < local_f0) {
    local_100 = 0;
    iVar18 = 2;
    uVar19 = 1;
    do {
      new_level.
      super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      new_level.
      super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      new_level.
      super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cost = compute_level<int,int,alex::AlexCompare>
                       (local_80,local_90,(ulong)local_f8 & 0xffffffff,local_88,local_ec,&new_level,
                        uVar19,max_data_node_keys,approximate_model_computation,
                        approximate_cost_computation);
      if (fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&fanout_costs,
                   (iterator)
                   fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,&cost);
      }
      else {
        *fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = cost;
        fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      uVar17 = (long)fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
      if (((0x10 < uVar17) &&
          (dVar1 = *(double *)
                    ((long)fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start + (uVar17 - 0x10)),
          dVar1 < *(double *)
                   ((long)fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start + (uVar17 - 8)))) &&
         (*(double *)
           ((long)fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + (uVar17 - 0x18)) < dVar1)) {
        if (new_level.
            super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(new_level.
                          super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)new_level.
                                super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)new_level.
                                super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        break;
      }
      if (cost < best_cost) {
        best_cost = cost;
        local_100 = uVar19;
      }
      std::
      vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
      ::push_back(&fanout_tree,&new_level);
      if (new_level.
          super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(new_level.
                        super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)new_level.
                              super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)new_level.
                              super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      iVar18 = iVar18 * 2;
      uVar19 = uVar19 + 1;
    } while (iVar18 <= local_f0);
  }
  uVar19 = local_100;
  pFVar2 = fanout_tree.
           super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[(int)local_100].
           super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pFVar3 = fanout_tree.
           super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[(int)local_100].
           super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pFVar2 != pFVar3) {
    auVar21 = vpbroadcastq_avx512f();
    auVar21 = vpsrlq_avx512f(auVar21,6);
    pbVar16 = &pFVar2[0x3f].use;
    uVar17 = 0;
    auVar22 = vpmovsxbq_avx512f(ZEXT816(0x3f3e3d3c3b3a3938));
    auVar23 = vpmovsxbq_avx512f(ZEXT816(0x3736353433323130));
    auVar24 = vpmovsxbq_avx512f(ZEXT816(0x2f2e2d2c2b2a2928));
    auVar25 = vpmovsxbq_avx512f(ZEXT816(0x2726252423222120));
    auVar26 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
    auVar27 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
    auVar28 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar29 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar30 = vpbroadcastq_avx512f();
      auVar31 = vporq_avx512f(auVar30,auVar29);
      uVar6 = vpcmpuq_avx512f(auVar31,auVar21,2);
      if ((uVar6 & 1) != 0) {
        pbVar16[-0x11b8] = true;
      }
      if ((uVar6 & 2) != 0) {
        pbVar16[-0x1170] = true;
      }
      if ((uVar6 & 4) != 0) {
        pbVar16[-0x1128] = true;
      }
      if ((uVar6 & 8) != 0) {
        pbVar16[-0x10e0] = true;
      }
      if ((uVar6 & 0x10) != 0) {
        pbVar16[-0x1098] = true;
      }
      if ((uVar6 & 0x20) != 0) {
        pbVar16[-0x1050] = true;
      }
      if ((uVar6 & 0x40) != 0) {
        pbVar16[-0x1008] = true;
      }
      if ((uVar6 & 0x80) != 0) {
        pbVar16[-0xfc0] = true;
      }
      auVar31 = vporq_avx512f(auVar30,auVar28);
      uVar6 = vpcmpuq_avx512f(auVar31,auVar21,2);
      if ((uVar6 & 1) != 0) {
        pbVar16[-0xf78] = true;
      }
      if ((uVar6 & 2) != 0) {
        pbVar16[-0xf30] = true;
      }
      if ((uVar6 & 4) != 0) {
        pbVar16[-0xee8] = true;
      }
      if ((uVar6 & 8) != 0) {
        pbVar16[-0xea0] = true;
      }
      if ((uVar6 & 0x10) != 0) {
        pbVar16[-0xe58] = true;
      }
      if ((uVar6 & 0x20) != 0) {
        pbVar16[-0xe10] = true;
      }
      if ((uVar6 & 0x40) != 0) {
        pbVar16[-0xdc8] = true;
      }
      if ((uVar6 & 0x80) != 0) {
        pbVar16[-0xd80] = true;
      }
      auVar31 = vporq_avx512f(auVar30,auVar27);
      uVar6 = vpcmpuq_avx512f(auVar31,auVar21,2);
      if ((uVar6 & 1) != 0) {
        pbVar16[-0xd38] = true;
      }
      if ((uVar6 & 2) != 0) {
        pbVar16[-0xcf0] = true;
      }
      if ((uVar6 & 4) != 0) {
        pbVar16[-0xca8] = true;
      }
      if ((uVar6 & 8) != 0) {
        pbVar16[-0xc60] = true;
      }
      if ((uVar6 & 0x10) != 0) {
        pbVar16[-0xc18] = true;
      }
      if ((uVar6 & 0x20) != 0) {
        pbVar16[-0xbd0] = true;
      }
      if ((uVar6 & 0x40) != 0) {
        pbVar16[-0xb88] = true;
      }
      if ((uVar6 & 0x80) != 0) {
        pbVar16[-0xb40] = true;
      }
      auVar31 = vporq_avx512f(auVar30,auVar26);
      uVar6 = vpcmpuq_avx512f(auVar31,auVar21,2);
      if ((uVar6 & 1) != 0) {
        pbVar16[-0xaf8] = true;
      }
      if ((uVar6 & 2) != 0) {
        pbVar16[-0xab0] = true;
      }
      if ((uVar6 & 4) != 0) {
        pbVar16[-0xa68] = true;
      }
      if ((uVar6 & 8) != 0) {
        pbVar16[-0xa20] = true;
      }
      if ((uVar6 & 0x10) != 0) {
        pbVar16[-0x9d8] = true;
      }
      if ((uVar6 & 0x20) != 0) {
        pbVar16[-0x990] = true;
      }
      if ((uVar6 & 0x40) != 0) {
        pbVar16[-0x948] = true;
      }
      if ((uVar6 & 0x80) != 0) {
        pbVar16[-0x900] = true;
      }
      auVar31 = vporq_avx512f(auVar30,auVar25);
      uVar6 = vpcmpuq_avx512f(auVar31,auVar21,2);
      if ((uVar6 & 1) != 0) {
        pbVar16[-0x8b8] = true;
      }
      if ((uVar6 & 2) != 0) {
        pbVar16[-0x870] = true;
      }
      if ((uVar6 & 4) != 0) {
        pbVar16[-0x828] = true;
      }
      if ((uVar6 & 8) != 0) {
        pbVar16[-0x7e0] = true;
      }
      if ((uVar6 & 0x10) != 0) {
        pbVar16[-0x798] = true;
      }
      if ((uVar6 & 0x20) != 0) {
        pbVar16[-0x750] = true;
      }
      if ((uVar6 & 0x40) != 0) {
        pbVar16[-0x708] = true;
      }
      if ((uVar6 & 0x80) != 0) {
        pbVar16[-0x6c0] = true;
      }
      auVar31 = vporq_avx512f(auVar30,auVar24);
      uVar6 = vpcmpuq_avx512f(auVar31,auVar21,2);
      if ((uVar6 & 1) != 0) {
        pbVar16[-0x678] = true;
      }
      if ((uVar6 & 2) != 0) {
        pbVar16[-0x630] = true;
      }
      if ((uVar6 & 4) != 0) {
        pbVar16[-0x5e8] = true;
      }
      if ((uVar6 & 8) != 0) {
        pbVar16[-0x5a0] = true;
      }
      if ((uVar6 & 0x10) != 0) {
        pbVar16[-0x558] = true;
      }
      if ((uVar6 & 0x20) != 0) {
        pbVar16[-0x510] = true;
      }
      if ((uVar6 & 0x40) != 0) {
        pbVar16[-0x4c8] = true;
      }
      if ((uVar6 & 0x80) != 0) {
        pbVar16[-0x480] = true;
      }
      auVar31 = vporq_avx512f(auVar30,auVar23);
      uVar6 = vpcmpuq_avx512f(auVar31,auVar21,2);
      if ((uVar6 & 1) != 0) {
        pbVar16[-0x438] = true;
      }
      if ((uVar6 & 2) != 0) {
        pbVar16[-0x3f0] = true;
      }
      if ((uVar6 & 4) != 0) {
        pbVar16[-0x3a8] = true;
      }
      if ((uVar6 & 8) != 0) {
        pbVar16[-0x360] = true;
      }
      if ((uVar6 & 0x10) != 0) {
        pbVar16[-0x318] = true;
      }
      if ((uVar6 & 0x20) != 0) {
        pbVar16[-0x2d0] = true;
      }
      if ((uVar6 & 0x40) != 0) {
        pbVar16[-0x288] = true;
      }
      if ((uVar6 & 0x80) != 0) {
        pbVar16[-0x240] = true;
      }
      auVar30 = vporq_avx512f(auVar30,auVar22);
      uVar6 = vpcmpuq_avx512f(auVar30,auVar21,2);
      if ((uVar6 & 1) != 0) {
        pbVar16[-0x1f8] = true;
      }
      if ((uVar6 & 2) != 0) {
        pbVar16[-0x1b0] = true;
      }
      if ((uVar6 & 4) != 0) {
        pbVar16[-0x168] = true;
      }
      if ((uVar6 & 8) != 0) {
        pbVar16[-0x120] = true;
      }
      if ((uVar6 & 0x10) != 0) {
        pbVar16[-0xd8] = true;
      }
      if ((uVar6 & 0x20) != 0) {
        pbVar16[-0x90] = true;
      }
      if ((uVar6 & 0x40) != 0) {
        pbVar16[-0x48] = true;
      }
      if ((uVar6 & 0x80) != 0) {
        *pbVar16 = true;
      }
      uVar17 = uVar17 + 0x40;
      pbVar16 = pbVar16 + 0x1200;
    } while (((ulong)((long)pFVar3 + (-0x48 - (long)pFVar2)) / 0x48 + 0x40 & 0xffffffffffffffc0) !=
             uVar17);
  }
  best_cost = merge_nodes_upwards<int,int>(local_100,best_cost,local_f8._0_4_,local_ec,&fanout_tree)
  ;
  uVar15 = (int)((ulong)((long)fanout_tree.
                               super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)fanout_tree.
                              super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555 - 1;
  if ((int)uVar19 <= (int)uVar15) {
    uVar15 = uVar19;
  }
  new_level.
  super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(new_level.
                         super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar15);
  if (-1 < (int)uVar15) {
    lVar20 = 0;
    do {
      pFVar4 = fanout_tree.
               super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar20].
               super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (__args = fanout_tree.
                    super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar20].
                    super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start; __args != pFVar4; __args = __args + 1
          ) {
        if (__args->use == true) {
          __position._M_current = *(FTNode **)(used_fanout_tree_nodes + 8);
          if (__position._M_current == *(FTNode **)(used_fanout_tree_nodes + 0x10)) {
            std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>::
            _M_realloc_insert<alex::fanout_tree::FTNode_const&>
                      (used_fanout_tree_nodes,__position,__args);
          }
          else {
            uVar11 = *(undefined4 *)&__args->field_0x44;
            (__position._M_current)->num_keys = __args->num_keys;
            *(undefined4 *)&(__position._M_current)->field_0x44 = uVar11;
            iVar18 = __args->node_id;
            dVar1 = __args->cost;
            iVar12 = __args->left_boundary;
            iVar13 = __args->right_boundary;
            bVar5 = __args->use;
            uVar14 = *(undefined7 *)&__args->field_0x19;
            dVar7 = __args->expected_avg_search_iterations;
            dVar8 = __args->expected_avg_shifts;
            dVar9 = __args->a;
            dVar10 = __args->b;
            (__position._M_current)->level = __args->level;
            (__position._M_current)->node_id = iVar18;
            (__position._M_current)->cost = dVar1;
            (__position._M_current)->left_boundary = iVar12;
            (__position._M_current)->right_boundary = iVar13;
            (__position._M_current)->use = bVar5;
            *(undefined7 *)&(__position._M_current)->field_0x19 = uVar14;
            (__position._M_current)->expected_avg_search_iterations = dVar7;
            (__position._M_current)->expected_avg_shifts = dVar8;
            (__position._M_current)->a = dVar9;
            (__position._M_current)->b = dVar10;
            *(long *)(used_fanout_tree_nodes + 8) = *(long *)(used_fanout_tree_nodes + 8) + 0x48;
          }
        }
      }
      bVar5 = lVar20 < (int)new_level.
                            super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                            ._M_impl.super__Vector_impl_data._M_start;
      lVar20 = lVar20 + 1;
    } while (bVar5);
  }
  __first._M_current = *(FTNode **)used_fanout_tree_nodes;
  __last._M_current = *(FTNode **)(used_fanout_tree_nodes + 8);
  if (__first._M_current != __last._M_current) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<alex::fanout_tree::FTNode*,std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<alex::fanout_tree::collect_used_nodes(std::vector<std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>,std::allocator<std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>>>const&,int,std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>&)::_lambda(alex::fanout_tree::FTNode&,alex::fanout_tree::FTNode&)_1_>>
              (__first,__last,
               (ulong)(uint)((int)LZCOUNT(((long)__last._M_current - (long)__first._M_current >> 3)
                                          * -0x71c71c71c71c71c7) * 2) ^ 0x7e,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_microsoft[P]ALEX_src_examples____core_alex_fanout_tree_h:51:13)>
                )&new_level);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<alex::fanout_tree::FTNode*,std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>>,__gnu_cxx::__ops::_Iter_comp_iter<alex::fanout_tree::collect_used_nodes(std::vector<std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>,std::allocator<std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>>>const&,int,std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>&)::_lambda(alex::fanout_tree::FTNode&,alex::fanout_tree::FTNode&)_1_>>
              (__first,__last,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_microsoft[P]ALEX_src_examples____core_alex_fanout_tree_h:51:13)>
                )&new_level);
  }
  local_f8 = best_cost;
  std::
  vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  ::~vector(&fanout_tree);
  if (fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pVar32._4_4_ = 0;
  pVar32.first = uVar19;
  pVar32.second = local_f8;
  return pVar32;
}

Assistant:

std::pair<int, double> find_best_fanout_bottom_up(
    const std::pair<T, P> values[], int num_keys, const AlexNode<T, P>* node,
    int total_keys, std::vector<FTNode>& used_fanout_tree_nodes, int max_fanout,
    int max_data_node_keys, double expected_insert_frac = 0,
    bool approximate_model_computation = true,
    bool approximate_cost_computation = false, Compare key_less = Compare()) {
  // Repeatedly add levels to the fanout tree until the overall cost of each
  // level starts to increase
  int best_level = 0;
  double best_cost = node->cost_ + kNodeLookupsWeight;
  std::vector<double> fanout_costs;
  std::vector<std::vector<FTNode>> fanout_tree;
  fanout_costs.push_back(best_cost);
  fanout_tree.push_back(
      {{0, 0, best_cost, 0, num_keys, false, 0, 0, 0, 0, num_keys}});
  for (int fanout = 2, fanout_tree_level = 1; fanout <= max_fanout;
       fanout *= 2, fanout_tree_level++) {
    std::vector<FTNode> new_level;
    double cost = compute_level<T, P, Compare>(
        values, num_keys, node, total_keys, new_level, fanout_tree_level,
        max_data_node_keys, expected_insert_frac, approximate_model_computation,
        approximate_cost_computation, key_less);
    fanout_costs.push_back(cost);
    if (fanout_costs.size() >= 3 &&
        fanout_costs[fanout_costs.size() - 1] >
            fanout_costs[fanout_costs.size() - 2] &&
        fanout_costs[fanout_costs.size() - 2] >
            fanout_costs[fanout_costs.size() - 3]) {
      break;
    }
    if (cost < best_cost) {
      best_cost = cost;
      best_level = fanout_tree_level;
    }
    fanout_tree.push_back(new_level);
  }
  for (FTNode& tree_node : fanout_tree[best_level]) {
    tree_node.use = true;
  }

  // Merge nodes to improve cost
  best_cost = merge_nodes_upwards<T, P>(best_level, best_cost, num_keys,
                                        total_keys, fanout_tree);

  collect_used_nodes(fanout_tree, best_level, used_fanout_tree_nodes);
  return std::make_pair(best_level, best_cost);
}